

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::dropEvent(QTableView *this,QDropEvent *event)

{
  iterator __first;
  bool bVar1;
  bool bVar2;
  DropAction DVar3;
  DragDropMode DVar4;
  uint uVar5;
  int iVar6;
  QTableViewPrivate *pQVar7;
  long *plVar8;
  ulong uVar9;
  QAbstractItemModel *pQVar10;
  QModelIndex *pQVar11;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QDropEvent *in_RSI;
  const_iterator cVar12;
  long *in_RDI;
  long in_FS_OFFSET;
  bool moved;
  QPersistentModelIndex *pIndex;
  add_const_t<QList<QPersistentModelIndex>_> *__range4;
  bool dataMoved;
  int r;
  QModelIndex *index;
  QModelIndexList *__range3;
  bool topIndexDropped;
  QTableViewPrivate *d;
  const_iterator __end4;
  const_iterator __begin4;
  QPersistentModelIndex dropRow;
  QPersistentModelIndex firstColIndex;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QPersistentModelIndex> persIndexes;
  QModelIndexList indexes;
  int row;
  int col;
  QModelIndex topIndex;
  QPersistentModelIndex *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint sourceRow;
  undefined4 in_stack_fffffffffffffe68;
  uint uVar13;
  uint in_stack_fffffffffffffe6c;
  iterator in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  QAbstractItemView *in_stack_fffffffffffffe90;
  uint local_15c;
  qsizetype in_stack_fffffffffffffec8;
  socklen_t local_110 [12];
  QPersistentModelIndex *local_e0;
  const_iterator local_d8;
  const_iterator local_d0;
  undefined1 local_c8 [24];
  undefined1 local_b0 [24];
  QPersistentModelIndex local_98;
  undefined1 local_90 [24];
  QPersistentModelIndex local_78;
  QModelIndex *local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QList<QModelIndex> local_40;
  uint local_28;
  uint local_24;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QTableView *)0x8bfa9e);
  plVar8 = (long *)QDropEvent::source();
  if ((plVar8 == in_RDI) &&
     ((DVar3 = QDropEvent::dropAction(in_RSI), DVar3 == MoveAction ||
      (DVar4 = QAbstractItemView::dragDropMode
                         ((QAbstractItemView *)
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
      DVar4 == InternalMove)))) {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_20.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8bfb20);
    local_24 = 0xffffffff;
    local_28 = 0xffffffff;
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if ((!bVar1) &&
       (((uVar9 = (**(code **)(*(long *)&(pQVar7->super_QAbstractItemViewPrivate).
                                         super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                         super_QWidgetPrivate + 0x110))
                            (pQVar7,in_RSI,&local_28,&local_24,&local_20), (uVar9 & 1) != 0 &&
         (bVar1 = QModelIndex::isValid
                            ((QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)), !bVar1)
         ) && (local_24 != 0xffffffff)))) {
      local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*in_RDI + 0x2d8))(&local_40);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8bfc25);
      QList<QModelIndex>::size(&local_40);
      QList<QPersistentModelIndex>::reserve
                ((QList<QPersistentModelIndex> *)
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffec8);
      bVar1 = false;
      local_60.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_60 = QList<QModelIndex>::begin
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_68.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QList<QModelIndex>::end
                           ((QList<QModelIndex> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      while( true ) {
        local_70 = local_68.i;
        bVar2 = QList<QModelIndex>::const_iterator::operator!=(&local_60,local_68);
        if (!bVar2) break;
        pQVar11 = QList<QModelIndex>::const_iterator::operator*(&local_60);
        local_78.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::siblingAtColumn
                  ((QModelIndex *)in_stack_fffffffffffffe70.i,in_stack_fffffffffffffe6c);
        QPersistentModelIndex::QPersistentModelIndex(&local_78,(QModelIndex *)local_90);
        bVar2 = QListSpecialMethodsBase<QPersistentModelIndex>::contains<QPersistentModelIndex>
                          ((QListSpecialMethodsBase<QPersistentModelIndex> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe58);
        if (!bVar2) {
          QList<QPersistentModelIndex>::append
                    ((QList<QPersistentModelIndex> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe58);
        }
        in_stack_fffffffffffffe7c = QModelIndex::row(pQVar11);
        iVar6 = QModelIndex::row(&local_20);
        bVar2 = in_stack_fffffffffffffe7c == iVar6;
        if (bVar2) {
          bVar1 = true;
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_78);
        if (bVar2) break;
        QList<QModelIndex>::const_iterator::operator++(&local_60);
      }
      if (!bVar1) {
        QList<QPersistentModelIndex>::begin
                  ((QList<QPersistentModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        QList<QPersistentModelIndex>::end
                  ((QList<QPersistentModelIndex> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        __first.i._4_4_ = in_stack_fffffffffffffe7c;
        __first.i._0_4_ = in_stack_fffffffffffffe78;
        std::sort<QList<QPersistentModelIndex>::iterator>(__first,in_stack_fffffffffffffe70);
        local_98.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar10 = QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe70.i);
        __addr_len = (socklen_t *)(ulong)local_24;
        (**(code **)(*(long *)pQVar10 + 0x60))(local_b0,pQVar10,local_28,__addr_len,&local_20);
        QPersistentModelIndex::QPersistentModelIndex(&local_98,(QModelIndex *)local_b0);
        if (local_28 == 0xffffffff) {
          in_stack_fffffffffffffe70.i =
               (QPersistentModelIndex *)
               QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe70.i);
          QModelIndex::QModelIndex((QModelIndex *)0x8bfe7c);
          local_15c = (**(code **)(*(long *)in_stack_fffffffffffffe70.i + 0x78))
                                (in_stack_fffffffffffffe70.i,local_c8);
        }
        else {
          iVar6 = QPersistentModelIndex::row();
          in_stack_fffffffffffffe6c = local_28;
          local_15c = local_28;
          if (-1 < iVar6) {
            in_stack_fffffffffffffe6c = QPersistentModelIndex::row();
            local_15c = in_stack_fffffffffffffe6c;
          }
        }
        bVar1 = false;
        local_d0.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_d0 = QList<QPersistentModelIndex>::begin
                             ((QList<QPersistentModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        local_d8.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8 = QList<QPersistentModelIndex>::end
                             ((QList<QPersistentModelIndex> *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        while( true ) {
          local_e0 = local_d8.i;
          cVar12.i = local_d8.i;
          bVar2 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_d0,local_d8);
          if (!bVar2) break;
          in_stack_fffffffffffffe90 =
               (QAbstractItemView *)
               QList<QPersistentModelIndex>::const_iterator::operator*(&local_d0);
          uVar13 = local_15c;
          uVar5 = QPersistentModelIndex::row();
          if (uVar13 == uVar5) {
LAB_008c0034:
            __addr_len = (socklen_t *)(ulong)uVar5;
LAB_008c0039:
            bVar1 = true;
            iVar6 = QPersistentModelIndex::row();
            local_15c = iVar6 + 1;
          }
          else {
            sourceRow = local_15c;
            iVar6 = QPersistentModelIndex::row();
            uVar5 = iVar6 + 1;
            if (sourceRow == uVar5) goto LAB_008c0034;
            pQVar11 = (QModelIndex *)
                      QAbstractItemView::model((QAbstractItemView *)in_stack_fffffffffffffe70.i);
            QModelIndex::QModelIndex((QModelIndex *)0x8bffe1);
            QPersistentModelIndex::row();
            QModelIndex::QModelIndex((QModelIndex *)0x8bfffc);
            __addr_len = local_110;
            in_stack_fffffffffffffe8f =
                 QAbstractItemModel::moveRow
                           ((QAbstractItemModel *)in_stack_fffffffffffffe70.i,
                            (QModelIndex *)CONCAT44(in_stack_fffffffffffffe6c,uVar13),sourceRow,
                            pQVar11,0);
            if ((bool)in_stack_fffffffffffffe8f) goto LAB_008c0039;
          }
          QList<QPersistentModelIndex>::const_iterator::operator++(&local_d0);
        }
        if (bVar1) {
          (pQVar7->super_QAbstractItemViewPrivate).dropEventMoved = true;
          QEvent::accept((QEvent *)in_RSI,(int)cVar12.i,__addr,__addr_len);
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_98);
      }
      QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x8c0099);
      QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8c00a6);
    }
  }
  bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
  if (!bVar1) {
    QAbstractItemView::dropEvent
              (in_stack_fffffffffffffe90,
               (QDropEvent *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::dropEvent(QDropEvent *event)
{
    Q_D(QTableView);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && !topIndex.isValid() && col != -1) {
            // Drop between items (reordering) - can only happen with setDragDropOverwriteMode(false)
            const QModelIndexList indexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(indexes.size());

            bool topIndexDropped = false;
            for (const auto &index : indexes) {
                // Reorder entire rows
                QPersistentModelIndex firstColIndex = index.siblingAtColumn(0);
                if (!persIndexes.contains(firstColIndex))
                    persIndexes.append(firstColIndex);
                if (index.row() == topIndex.row()) {
                    topIndexDropped = true;
                    break;
                }
            }
            if (!topIndexDropped) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved) {
                    d->dropEventMoved = true;
                    event->accept();
                }
            }
        }
    }

    if (!event->isAccepted()) {
        // moveRows not implemented, fall back to default
        QAbstractItemView::dropEvent(event);
    }
}